

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O0

MAP_HANDLE create_link_attach_properties(TWIN_MESSENGER_INSTANCE_conflict *twin_msgr)

{
  MAP_RESULT MVar1;
  LOGGER_LOG p_Var2;
  char *value;
  char *value_00;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  char *correlation_id;
  LOGGER_LOG l;
  MAP_HANDLE result;
  TWIN_MESSENGER_INSTANCE_conflict *twin_msgr_local;
  
  l = (LOGGER_LOG)Map_Create((MAP_FILTER_CALLBACK)0x0);
  if ((MAP_HANDLE)l == (MAP_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"create_link_attach_properties",0x29f,1,
                "Failed creating map for AMQP link properties (%s)",twin_msgr->device_id);
    }
  }
  else {
    value = generate_twin_correlation_id();
    if (value == (char *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                  ,"create_link_attach_properties",0x2a7,1,"Failed adding AMQP link property ");
      }
      destroy_link_attach_properties((MAP_HANDLE)l);
      l = (LOGGER_LOG)0x0;
    }
    else {
      value_00 = (*twin_msgr->prod_info_cb)(twin_msgr->prod_info_ctx);
      MVar1 = Map_Add((MAP_HANDLE)l,"com.microsoft:client-version",value_00);
      if (MVar1 == MAP_OK) {
        MVar1 = Map_Add((MAP_HANDLE)l,"com.microsoft:channel-correlation-id",value);
        if (MVar1 == MAP_OK) {
          MVar1 = Map_Add((MAP_HANDLE)l,"com.microsoft:api-version","2020-09-30");
          if (MVar1 != MAP_OK) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                        ,"create_link_attach_properties",699,1,
                        "Failed adding AMQP link property \'api-version\' (%s)",twin_msgr->device_id
                       );
            }
            destroy_link_attach_properties((MAP_HANDLE)l);
            l = (LOGGER_LOG)0x0;
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                      ,"create_link_attach_properties",0x2b5,1,
                      "Failed adding AMQP link property \'correlation-id\' (%s)",
                      twin_msgr->device_id);
          }
          destroy_link_attach_properties((MAP_HANDLE)l);
          l = (LOGGER_LOG)0x0;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"create_link_attach_properties",0x2af,1,
                    "Failed adding AMQP link property \'client version\' (%s)",twin_msgr->device_id)
          ;
        }
        destroy_link_attach_properties((MAP_HANDLE)l);
        l = (LOGGER_LOG)0x0;
      }
      free(value);
    }
  }
  return (MAP_HANDLE)l;
}

Assistant:

static MAP_HANDLE create_link_attach_properties(TWIN_MESSENGER_INSTANCE* twin_msgr)
{
    MAP_HANDLE result;

    if ((result = Map_Create(NULL)) == NULL)
    {
        LogError("Failed creating map for AMQP link properties (%s)", twin_msgr->device_id);
    }
    else
    {
        char* correlation_id;

        if ((correlation_id = generate_twin_correlation_id()) == NULL)
        {
            LogError("Failed adding AMQP link property ");
            destroy_link_attach_properties(result);
            result = NULL;
        }
        else
        {
            if (Map_Add(result, CLIENT_VERSION_PROPERTY_NAME, twin_msgr->prod_info_cb(twin_msgr->prod_info_ctx) ) != MAP_OK)
            {
                LogError("Failed adding AMQP link property 'client version' (%s)", twin_msgr->device_id);
                destroy_link_attach_properties(result);
                result = NULL;
            }
            else if (Map_Add(result, TWIN_CORRELATION_ID_PROPERTY_NAME, correlation_id) != MAP_OK)
            {
                LogError("Failed adding AMQP link property 'correlation-id' (%s)", twin_msgr->device_id);
                destroy_link_attach_properties(result);
                result = NULL;
            }
            else if (Map_Add(result, TWIN_API_VERSION_PROPERTY_NAME, IOTHUB_API_VERSION) != MAP_OK)
            {
                LogError("Failed adding AMQP link property 'api-version' (%s)", twin_msgr->device_id);
                destroy_link_attach_properties(result);
                result = NULL;
            }

            free(correlation_id);
        }
    }

    return result;
}